

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::scrollTo(QTableView *this,QModelIndex *index,ScrollHint hint)

{
  QSpanCollection *pQVar1;
  QTableViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  QWidgetData *pQVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ScrollMode SVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QScrollBar *pQVar13;
  int iVar14;
  long in_FS_OFFSET;
  ScrollHint local_78;
  int local_64;
  int local_60;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar4 = QAbstractItemViewPrivate::isIndexValid(&this_00->super_QAbstractItemViewPrivate,index);
  if (!bVar4) goto LAB_0052e7ef;
  pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
  (**(code **)(*(long *)pQVar2 + 0x68))(&local_50,pQVar2,index);
  bVar4 = ::operator!=(&local_50,&(this_00->super_QAbstractItemViewPrivate).root);
  if (((bVar4) || (bVar4 = isRowHidden(this,index->r), bVar4)) ||
     (bVar4 = isColumnHidden(this,index->c), bVar4)) goto LAB_0052e7ef;
  pQVar1 = &this_00->spans;
  if ((QSpanCollection *)
      (this_00->spans).spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next == pQVar1) {
    local_50.c = -1;
    local_50.i._4_4_ = 0;
    local_60 = 0;
    local_64 = local_50.c;
  }
  else {
    QTableViewPrivate::span((Span *)&local_50,this_00,index->r,index->c);
    local_64 = local_50.r;
    local_50.i._4_4_ = local_50.i._4_4_ + 1;
    local_60 = (int)local_50.i + 1;
  }
  pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  iVar14 = (pQVar3->crect).x2.m_i;
  iVar12 = (pQVar3->crect).x1.m_i;
  iVar5 = QHeaderView::offset(this_00->horizontalHeader);
  iVar6 = QHeaderView::sectionPosition(this_00->horizontalHeader,index->c);
  iVar7 = QHeaderView::visualIndex(this_00->horizontalHeader,index->c);
  if ((QSpanCollection *)
      (this_00->spans).spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next == pQVar1) {
    iVar8 = QHeaderView::sectionSize(this_00->horizontalHeader,index->c);
  }
  else {
    iVar8 = QTableViewPrivate::columnSpanWidth(this_00,index->c,local_50.i._4_4_ - local_50.c);
  }
  iVar14 = (iVar14 - iVar12) + 1;
  SVar9 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
  if (SVar9 == ScrollPerItem) {
    iVar12 = (iVar6 - iVar5) + iVar8;
    if ((hint == PositionAtCenter) || (iVar14 < iVar12)) {
      iVar11 = iVar7;
      iVar10 = iVar14 / 2;
      if (hint != PositionAtCenter) {
        iVar10 = iVar14;
      }
      do {
        iVar7 = iVar11;
        if (iVar7 < 1) break;
        iVar11 = QHeaderView::logicalIndex(this_00->horizontalHeader,iVar7 + -1);
        iVar11 = columnWidth(this,iVar11);
        iVar8 = iVar8 + iVar11;
        iVar11 = iVar7 + -1;
      } while (iVar8 <= iVar10);
    }
    if (((hint == PositionAtCenter) || (iVar14 < iVar12)) || (iVar6 - iVar5 < 0)) {
      bVar4 = QHeaderView::sectionsHidden(this_00->horizontalHeader);
      iVar6 = 0;
      if (bVar4) {
        iVar6 = 0;
        iVar14 = iVar7;
        while (0 < iVar14) {
          iVar14 = iVar14 + -1;
          iVar12 = QHeaderView::logicalIndex(this_00->horizontalHeader,iVar14);
          bVar4 = QHeaderView::isSectionHidden(this_00->horizontalHeader,iVar12);
          iVar6 = iVar6 + (uint)bVar4;
        }
      }
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar6 = iVar7 - iVar6;
      goto LAB_0052e5fb;
    }
  }
  else {
    if (hint == PositionAtCenter) {
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar6 = iVar6 + (iVar14 - iVar8) / -2;
    }
    else if ((iVar6 - iVar5 < 0) || (iVar14 < iVar8)) {
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    }
    else {
      if ((iVar6 - iVar5) + iVar8 <= iVar14) goto LAB_0052e600;
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar6 = (iVar6 - iVar14) + iVar8;
    }
LAB_0052e5fb:
    QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar6);
  }
LAB_0052e600:
  pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  iVar14 = (pQVar3->crect).y2.m_i;
  iVar12 = (pQVar3->crect).y1.m_i;
  iVar5 = QHeaderView::offset(this_00->verticalHeader);
  iVar6 = QHeaderView::sectionPosition(this_00->verticalHeader,index->r);
  iVar7 = QHeaderView::visualIndex(this_00->verticalHeader,index->r);
  if ((QSpanCollection *)
      (this_00->spans).spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next == pQVar1) {
    iVar8 = QHeaderView::sectionSize(this_00->verticalHeader,index->r);
  }
  else {
    iVar8 = QTableViewPrivate::rowSpanHeight(this_00,index->r,local_60 - local_64);
  }
  iVar14 = (iVar14 - iVar12) + 1;
  if ((iVar6 - iVar5 < 0) || (iVar14 < iVar8)) {
    local_78 = hint + (hint == EnsureVisible);
  }
  else {
    local_78 = hint;
    if ((iVar14 < (iVar6 - iVar5) + iVar8) && (hint == EnsureVisible)) {
      local_78 = PositionAtBottom;
    }
  }
  SVar9 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar9 == ScrollPerItem) {
    if ((local_78 & ~PositionAtTop) == PositionAtBottom) {
      iVar12 = iVar7;
      iVar5 = iVar14 / 2;
      if (local_78 != PositionAtCenter) {
        iVar5 = iVar14;
      }
      do {
        iVar7 = iVar12;
        if (iVar7 < 1) break;
        iVar14 = QHeaderView::logicalIndex(this_00->verticalHeader,iVar7 + -1);
        iVar14 = QHeaderView::sectionSize(this_00->verticalHeader,iVar14);
        iVar8 = iVar8 + iVar14;
        iVar12 = iVar7 + -1;
      } while (iVar8 <= iVar5);
    }
    if (local_78 - PositionAtTop < 3) {
      bVar4 = QHeaderView::sectionsHidden(this_00->verticalHeader);
      iVar6 = 0;
      if (bVar4) {
        iVar6 = 0;
        iVar14 = iVar7;
        while (0 < iVar14) {
          iVar14 = iVar14 + -1;
          iVar12 = QHeaderView::logicalIndex(this_00->verticalHeader,iVar14);
          bVar4 = QHeaderView::isSectionHidden(this_00->verticalHeader,iVar12);
          iVar6 = iVar6 + (uint)bVar4;
        }
      }
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar6 = iVar7 - iVar6;
      goto LAB_0052e7df;
    }
  }
  else {
    if (local_78 == PositionAtCenter) {
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar6 = iVar6 + (iVar14 - iVar8) / -2;
    }
    else if (local_78 == PositionAtBottom) {
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar6 = (iVar6 - iVar14) + iVar8;
    }
    else {
      if (local_78 != PositionAtTop) goto LAB_0052e7e4;
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    }
LAB_0052e7df:
    QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar6);
  }
LAB_0052e7e4:
  QAbstractItemView::update((QAbstractItemView *)this,index);
LAB_0052e7ef:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QTableView);

    // check if we really need to do anything
    if (!d->isIndexValid(index)
        || (d->model->parent(index) != d->root)
        || isRowHidden(index.row()) || isColumnHidden(index.column()))
        return;

    QSpanCollection::Span span;
    if (d->hasSpans())
        span = d->span(index.row(), index.column());

    // Adjust horizontal position

    int viewportWidth = d->viewport->width();
    int horizontalOffset = d->horizontalHeader->offset();
    int horizontalPosition = d->horizontalHeader->sectionPosition(index.column());
    int horizontalIndex = d->horizontalHeader->visualIndex(index.column());
    int cellWidth = d->hasSpans()
                    ? d->columnSpanWidth(index.column(), span.width())
                    : d->horizontalHeader->sectionSize(index.column());

    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {

        bool positionAtLeft = (horizontalPosition - horizontalOffset < 0);
        bool positionAtRight = (horizontalPosition - horizontalOffset + cellWidth > viewportWidth);

        if (hint == PositionAtCenter || positionAtRight) {
            int w = (hint == PositionAtCenter ? viewportWidth / 2 : viewportWidth);
            int x = cellWidth;
            while (horizontalIndex > 0) {
                x += columnWidth(d->horizontalHeader->logicalIndex(horizontalIndex-1));
                if (x > w)
                    break;
                --horizontalIndex;
            }
        }

        if (positionAtRight || hint == PositionAtCenter || positionAtLeft) {
            int hiddenSections = 0;
            if (d->horizontalHeader->sectionsHidden()) {
                for (int s = horizontalIndex - 1; s >= 0; --s) {
                    int column = d->horizontalHeader->logicalIndex(s);
                    if (d->horizontalHeader->isSectionHidden(column))
                        ++hiddenSections;
                }
            }
            horizontalScrollBar()->setValue(horizontalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtCenter) {
            horizontalScrollBar()->setValue(horizontalPosition - ((viewportWidth - cellWidth) / 2));
        } else {
            if (horizontalPosition - horizontalOffset < 0 || cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition);
            else if (horizontalPosition - horizontalOffset + cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition - viewportWidth + cellWidth);
        }
    }

    // Adjust vertical position

    int viewportHeight = d->viewport->height();
    int verticalOffset = d->verticalHeader->offset();
    int verticalPosition = d->verticalHeader->sectionPosition(index.row());
    int verticalIndex = d->verticalHeader->visualIndex(index.row());
    int cellHeight = d->hasSpans()
                     ? d->rowSpanHeight(index.row(), span.height())
                     : d->verticalHeader->sectionSize(index.row());

    if (verticalPosition - verticalOffset < 0 || cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtTop;
    } else if (verticalPosition - verticalOffset + cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtBottom;
    }

    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {

        if (hint == PositionAtBottom || hint == PositionAtCenter) {
            int h = (hint == PositionAtCenter ? viewportHeight / 2 : viewportHeight);
            int y = cellHeight;
            while (verticalIndex > 0) {
                int row = d->verticalHeader->logicalIndex(verticalIndex - 1);
                y += d->verticalHeader->sectionSize(row);
                if (y > h)
                    break;
                --verticalIndex;
            }
        }

        if (hint == PositionAtBottom || hint == PositionAtCenter || hint == PositionAtTop) {
            int hiddenSections = 0;
            if (d->verticalHeader->sectionsHidden()) {
                for (int s = verticalIndex - 1; s >= 0; --s) {
                    int row = d->verticalHeader->logicalIndex(s);
                    if (d->verticalHeader->isSectionHidden(row))
                        ++hiddenSections;
                }
            }
            verticalScrollBar()->setValue(verticalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtTop) {
            verticalScrollBar()->setValue(verticalPosition);
        } else if (hint == PositionAtBottom) {
            verticalScrollBar()->setValue(verticalPosition - viewportHeight + cellHeight);
        } else if (hint == PositionAtCenter) {
            verticalScrollBar()->setValue(verticalPosition - ((viewportHeight - cellHeight) / 2));
        }
    }

    update(index);
}